

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O3

void __thiscall
Ext_IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
Ext_IndexNode(Ext_IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *this,int N)

{
  pointer pcVar1;
  pointer pcVar2;
  pointer pAVar3;
  pointer pAVar4;
  allocator_type local_59;
  vector<Addr,_std::allocator<Addr>_> local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  
  (this->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  (this->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->k).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  (this->k).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->k).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_38,(long)N,&local_59);
  local_58.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)(this->k).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->k).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_38.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_58.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)(this->k).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  local_58.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)(this->k).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
  (this->k).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_38.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->k).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_38.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_38.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_58);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_38);
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&local_58,(long)N,(allocator_type *)&local_38);
  pcVar1 = (this->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
           ._M_start;
  pcVar2 = (this->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
           ._M_end_of_storage;
  (this->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)local_58.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                  super__Vector_impl_data._M_start;
  (this->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)local_58.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                       super__Vector_impl_data._M_finish;
  (this->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)local_58.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
  local_58.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_58.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_58.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (pcVar1 != (pointer)0x0) {
    operator_delete(pcVar1,(long)pcVar2 - (long)pcVar1);
    if (local_58.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_58.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_58.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  std::vector<Addr,_std::allocator<Addr>_>::vector
            (&local_58,(long)(N + 1),(allocator_type *)&local_38);
  pAVar3 = (this->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data
           ._M_start;
  pAVar4 = (this->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data
           ._M_end_of_storage;
  (this->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data._M_start
       = local_58.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
         _M_start;
  (this->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_58.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
              super__Vector_impl_data._M_finish;
  (this->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_58.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_58.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_58.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_58.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (pAVar3 != (pointer)0x0) {
    operator_delete(pAVar3,(long)pAVar4 - (long)pAVar3);
    if (local_58.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_58.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_58.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

Ext_IndexNode(int N) {
		k = vector<K>(N);
		v = vector<char>(N);
		p = vector<Addr>(N + 1);
	}